

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTypeRefining.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::AbstractTypeRefining::optimize
          (AbstractTypeRefining *this,Module *module,SubTypes *subTypes)

{
  __node_base_ptr this_00;
  bool bVar1;
  BasicHeapType id;
  reference pHVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  PassRunner *runner;
  ReFinalize local_2d0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_168;
  TypeMapper local_150;
  uint local_a4;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_a0;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_98;
  iterator iter;
  HeapType local_78;
  HeapType type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  TypeUpdates mapping;
  SubTypes *subTypes_local;
  Module *module_local;
  AbstractTypeRefining *this_local;
  
  mapping._M_h._M_single_bucket = (__node_base_ptr)subTypes;
  std::
  unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
  ::unordered_map((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                   *)&__range2);
  this_00 = mapping._M_h._M_single_bucket;
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                     ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                      mapping._M_h._M_single_bucket);
  type.id = (uintptr_t)
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&type), bVar1) {
    pHVar2 = __gnu_cxx::
             __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    local_78.id = pHVar2->id;
    bVar1 = HeapType::isStruct(&local_78);
    if (bVar1) {
      sVar3 = std::
              unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
              ::count(&this->createdTypesOrSubTypes,&local_78);
      if (sVar3 == 0) {
        id = HeapType::getBottom(&local_78);
        HeapType::HeapType((HeapType *)&iter,id);
        pmVar4 = std::
                 unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                               *)&__range2,&local_78);
        pmVar4->id = (uintptr_t)
                     iter.
                     super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                     ._M_cur;
      }
      else {
        local_98._M_cur =
             (__node_type *)
             std::
             unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
             ::find(&this->refinableTypes,&local_78);
        local_a0._M_cur =
             (__node_type *)
             std::
             unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
             ::end(&this->refinableTypes);
        bVar1 = std::__detail::operator!=(&local_98,&local_a0);
        if (bVar1) {
          ppVar5 = std::__detail::
                   _Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
                   operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>
                               *)&local_98);
          pmVar4 = std::
                   unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                   ::operator[]((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                                 *)&__range2,&local_78);
          pmVar4->id = (ppVar5->second).id;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::
          unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
          ::empty((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                   *)&__range2);
  if (!bVar1) {
    wasm::(anonymous_namespace)::AbstractTypeRefining::optimize(wasm::Module*,wasm::SubTypes_const&)
    ::AbstractTypeRefiningTypeMapper::AbstractTypeRefiningTypeMapper(wasm::Module&,std::
    unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std::equal_to<wasm::
    HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::HeapType>_>_>_const__
              (&local_150,module,(TypeUpdates *)&__range2);
    local_168.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_168);
    TypeMapper::map(&local_150,&local_168);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_168);
    optimize::AbstractTypeRefiningTypeMapper::~AbstractTypeRefiningTypeMapper
              ((AbstractTypeRefiningTypeMapper *)&local_150);
    ReFinalize::ReFinalize(&local_2d0);
    runner = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    ::run(&local_2d0.
           super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          ,runner,module);
    ReFinalize::~ReFinalize(&local_2d0);
  }
  local_a4 = (uint)bVar1;
  std::
  unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
  ::~unordered_map((unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
                    *)&__range2);
  return;
}

Assistant:

void optimize(Module* module, const SubTypes& subTypes) {
    // To optimize we rewrite types. That is, if we want to optimize all casts
    // of $A to instead cast to the refined type $B, we can do that by simply
    // replacing all appearances of $A with $B. That is possible here since we
    // only optimize when we know $A is never created, and we are removing all
    // casts to it, which means no other references to it are needed - so we can
    // just rewrite all references to $A to point to $B. Doing such a rewrite
    // will also remove the unneeded type from the type section, which is nice
    // for code size.
    //
    // Even though this pass removes types, it does not on its own inhibit
    // further optimizations. In more detail, a possible issue could have been
    // something like this: imagine that we replace all $A with $B, and we had
    // types like this:
    //
    //  $C = [.., $A, ..]
    //  $D = [.., $B, ..]
    //
    // After replacing $A with $B, we cause $C and $D to be structurally
    // identical. If we merged $C and $D then we might lose some optimization
    // potential (perhaps different values are written to each, and GUFA or
    // another pass can optimize each separately, but not if they were merged).
    // However, the type rewriter will create a single new rec group for all new
    // types anyhow, so they all remain distinct from each other. The only thing
    // that would actually merge them is if we run TypeMerging, which is not run
    // by default exactly for this reason, that it can limit optimizations.
    // Thus, this pass does only "safe" merging, that cannot limit later
    // optimizations - merging $A and $B is of course fine as one of them was
    // not even used anywhere.

    TypeMapper::TypeUpdates mapping;

    for (auto type : subTypes.types) {
      if (!type.isStruct()) {
        // TODO: support arrays and funcs
        continue;
      }

      // Add a mapping of types that are never created (and none of their
      // subtypes) to the bottom type. This is valid because all locations of
      // that type, like a local variable, will only contain null at runtime.
      // Likewise, if we have a ref.test of such a type, we can only be looking
      // for a null at best. This can be seen as "refining" uses of these
      // never-created types to the bottom type.
      //
      // We check this first as it is the most powerful change.
      if (createdTypesOrSubTypes.count(type) == 0) {
        mapping[type] = type.getBottom();
        continue;
      }

      // Otherwise, apply a refining if we found one before.
      if (auto iter = refinableTypes.find(type); iter != refinableTypes.end()) {
        mapping[type] = iter->second;
      }
    }

    if (mapping.empty()) {
      return;
    }

    // A TypeMapper that handles the patterns we have in our mapping, where we
    // end up mapping a type to a *subtype*. We need to properly create
    // supertypes while doing this rewriting. For example, say we have this:
    //
    //  A :> B :> C
    //
    // Say we see B is never created, so we want to map B to its subtype C. C's
    // supertype must now be A.
    class AbstractTypeRefiningTypeMapper : public TypeMapper {
    public:
      AbstractTypeRefiningTypeMapper(Module& wasm, const TypeUpdates& mapping)
        : TypeMapper(wasm, mapping) {}

      std::optional<HeapType> getDeclaredSuperType(HeapType oldType) override {
        auto super = oldType.getDeclaredSuperType();

        // Go up the chain of supertypes, skipping things we are mapping away,
        // as those things will not appear in the output. This skips B in the
        // example above.
        while (super && mapping.count(*super)) {
          super = super->getDeclaredSuperType();
        }
        return super;
      }
    };

    AbstractTypeRefiningTypeMapper(*module, mapping).map();

    // Refinalize to propagate the type changes we made. For example, a refined
    // cast may lead to a struct.get reading a more refined type using that
    // type.
    ReFinalize().run(getPassRunner(), module);
  }